

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedResult.cpp
# Opt level: O3

string * __thiscall
oout::NamedResult::print_abi_cxx11_(string *__return_storage_ptr__,NamedResult *this,Format *format)

{
  element_type *peVar1;
  pointer pcVar2;
  undefined **local_48;
  Format *local_40;
  long *local_38 [2];
  long local_28 [2];
  
  peVar1 = (this->result).super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48 = &PTR__FmtNamed_001208f8;
  pcVar2 = (this->name)._M_dataplus._M_p;
  local_40 = format;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar2,pcVar2 + (this->name)._M_string_length);
  (*peVar1->_vptr_Result[2])(__return_storage_ptr__,peVar1,&local_48);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string NamedResult::print(const Format &format) const
{
	return result->print(FmtNamed(&format, name));
}